

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O2

void __thiscall OpenMD::TimeCorrFunc<int>::computeFrame(TimeCorrFunc<int> *this,int istep)

{
  pointer pvVar1;
  uint uVar2;
  Molecule *pMVar3;
  long lVar4;
  StuntDouble *pSVar5;
  Bond *pBVar6;
  long lVar7;
  uint *puVar8;
  pointer pvVar9;
  int ibond2;
  int ibond1;
  int isd2;
  int isd1;
  int imol2;
  int imol1;
  uint local_64;
  SelectionSet local_60;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_64 = istep;
  if ((this->evaluator1_).isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_60,&this->evaluator1_);
    SelectionManager::setSelectionSet(&this->seleMan1_,&local_60);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[7])(this,&this->seleMan1_);
  }
  if ((this->uniqueSelections_ == true) && ((this->evaluator2_).isDynamic_ == true)) {
    SelectionEvaluator::evaluate(&local_60,&this->evaluator2_);
    SelectionManager::setSelectionSet(&this->seleMan2_,&local_60);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[7])(this,&this->seleMan2_);
  }
  if (this->doSystemProperties_ == true) {
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[10])(this,(ulong)local_64);
    if (this->autoCorrFunc_ == false) {
      (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xb])(this,(ulong)local_64);
    }
  }
  if (this->doMolecularProperties_ == true) {
    if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
      local_60.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = -1;
      std::vector<int,_std::allocator<int>_>::resize
                ((this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                 (long)this->info_->nGlobalMols_,(value_type_conflict2 *)&local_60);
    }
    pMVar3 = SelectionManager::beginSelectedMolecule(&this->seleMan1_,&local_34);
    while (pMVar3 != (Molecule *)0x0) {
      uVar2 = (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xd])
                        (this,(ulong)local_64,pMVar3);
      lVar4 = (long)(int)local_64;
      pvVar9 = (this->sele1ToIndex_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          *(long *)&pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data >> 2 == (ulong)uVar2) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = pMVar3->globalIndex_;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar9 + lVar4,(int *)&local_60);
      }
      else {
        std::vector<int,_std::allocator<int>_>::resize(pvVar9 + lVar4,(ulong)(uVar2 + 1));
        *(int *)(*(long *)&(this->sele1ToIndex_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + (ulong)uVar2 * 4) = pMVar3->globalIndex_;
      }
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        pvVar9 = (this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(uint *)(*(long *)&pvVar9[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data + (long)pMVar3->globalIndex_ * 4) =
             uVar2;
        lVar4 = (long)(int)local_64;
        if (lVar4 == 0) {
          pvVar9 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_0014ba4a:
          puVar8 = &local_64;
        }
        else {
          lVar7 = (long)*(int *)(*(long *)&pvVar9[lVar4 + -1].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                (long)pMVar3->globalIndex_ * 4);
          pvVar1 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar9 = pvVar1 + lVar4;
          if (lVar7 == -1) goto LAB_0014ba4a;
          puVar8 = (uint *)(lVar7 * 4 +
                           *(long *)&pvVar1[lVar4 + -1].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data);
        }
        std::vector<int,_std::allocator<int>_>::push_back(pvVar9,(value_type_conflict2 *)puVar8);
      }
      if (this->uniqueSelections_ == false) {
        (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xe])(this,(ulong)local_64,pMVar3);
      }
      pMVar3 = SelectionManager::nextSelectedMolecule(&this->seleMan1_,&local_34);
    }
    if (this->uniqueSelections_ == true) {
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = -1;
        std::vector<int,_std::allocator<int>_>::resize
                  ((this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                   (long)this->info_->nGlobalMols_,(value_type_conflict2 *)&local_60);
      }
      pMVar3 = SelectionManager::beginSelectedMolecule(&this->seleMan2_,&local_38);
      while (pMVar3 != (Molecule *)0x0) {
        uVar2 = (*(this->super_DynamicProperty)._vptr_DynamicProperty
                  [(ulong)(this->autoCorrFunc_ ^ 1) + 0xd])(this,(ulong)local_64,pMVar3);
        lVar4 = (long)(int)local_64;
        pvVar9 = (this->sele2ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            *(long *)&pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data >> 2 == (ulong)uVar2) {
          local_60.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = pMVar3->globalIndex_;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar9 + lVar4,(int *)&local_60)
          ;
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(pvVar9 + lVar4,(ulong)(uVar2 + 1));
          *(int *)(*(long *)&(this->sele2ToIndex_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar2 * 4) = pMVar3->globalIndex_;
        }
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar9 = (this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(uint *)(*(long *)&pvVar9[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data + (long)pMVar3->globalIndex_ * 4) =
               uVar2;
          lVar4 = (long)(int)local_64;
          if (lVar4 == 0) {
            pvVar9 = (this->selection2StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0014bbbe:
            puVar8 = &local_64;
          }
          else {
            lVar7 = (long)*(int *)(*(long *)&pvVar9[lVar4 + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)pMVar3->globalIndex_ * 4);
            pvVar1 = (this->selection2StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar9 = pvVar1 + lVar4;
            if (lVar7 == -1) goto LAB_0014bbbe;
            puVar8 = (uint *)(lVar7 * 4 +
                             *(long *)&pvVar1[lVar4 + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data);
          }
          std::vector<int,_std::allocator<int>_>::push_back(pvVar9,(value_type_conflict2 *)puVar8);
        }
        pMVar3 = SelectionManager::nextSelectedMolecule(&this->seleMan2_,&local_38);
      }
    }
  }
  if (this->doObjectProperties_ == true) {
    if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
      local_60.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = -1;
      std::vector<int,_std::allocator<int>_>::resize
                ((this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                 (long)this->info_->nGlobalIntegrableObjects_,(value_type_conflict2 *)&local_60);
    }
    pSVar5 = SelectionManager::beginSelected(&this->seleMan1_,&local_3c);
    while (pSVar5 != (StuntDouble *)0x0) {
      uVar2 = (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xf])
                        (this,(ulong)local_64,pSVar5);
      lVar4 = (long)(int)local_64;
      pvVar9 = (this->sele1ToIndex_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          *(long *)&pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data >> 2 == (ulong)uVar2) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = pSVar5->globalIndex_;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar9 + lVar4,(int *)&local_60);
      }
      else {
        std::vector<int,_std::allocator<int>_>::resize(pvVar9 + lVar4,(ulong)(uVar2 + 1));
        *(int *)(*(long *)&(this->sele1ToIndex_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + (ulong)uVar2 * 4) = pSVar5->globalIndex_;
      }
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        pvVar9 = (this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(uint *)(*(long *)&pvVar9[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data + (long)pSVar5->globalIndex_ * 4) =
             uVar2;
        lVar4 = (long)(int)local_64;
        if (lVar4 == 0) {
          pvVar9 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_0014bd0e:
          puVar8 = &local_64;
        }
        else {
          lVar7 = (long)*(int *)(*(long *)&pvVar9[lVar4 + -1].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                (long)pSVar5->globalIndex_ * 4);
          pvVar1 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar9 = pvVar1 + lVar4;
          if (lVar7 == -1) goto LAB_0014bd0e;
          puVar8 = (uint *)(lVar7 * 4 +
                           *(long *)&pvVar1[lVar4 + -1].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data);
        }
        std::vector<int,_std::allocator<int>_>::push_back(pvVar9,(value_type_conflict2 *)puVar8);
      }
      if (this->uniqueSelections_ == false) {
        (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x10])(this,(ulong)local_64,pSVar5);
      }
      pSVar5 = SelectionManager::nextSelected(&this->seleMan1_,&local_3c);
    }
    if (this->uniqueSelections_ == true) {
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = -1;
        std::vector<int,_std::allocator<int>_>::resize
                  ((this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                   (long)this->info_->nGlobalIntegrableObjects_,(value_type_conflict2 *)&local_60);
      }
      pSVar5 = SelectionManager::beginSelected(&this->seleMan2_,&local_40);
      while (pSVar5 != (StuntDouble *)0x0) {
        uVar2 = (*(this->super_DynamicProperty)._vptr_DynamicProperty
                  [(ulong)(this->autoCorrFunc_ ^ 1) + 0xf])(this,(ulong)local_64,pSVar5);
        lVar4 = (long)(int)local_64;
        pvVar9 = (this->sele2ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            *(long *)&pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data >> 2 == (ulong)uVar2) {
          local_60.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = pSVar5->globalIndex_;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar9 + lVar4,(int *)&local_60)
          ;
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(pvVar9 + lVar4,(ulong)(uVar2 + 1));
          *(int *)(*(long *)&(this->sele2ToIndex_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar2 * 4) = pSVar5->globalIndex_;
        }
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar9 = (this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(uint *)(*(long *)&pvVar9[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data + (long)pSVar5->globalIndex_ * 4) =
               uVar2;
          lVar4 = (long)(int)local_64;
          if (lVar4 == 0) {
            pvVar9 = (this->selection2StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0014be85:
            puVar8 = &local_64;
          }
          else {
            lVar7 = (long)*(int *)(*(long *)&pvVar9[lVar4 + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)pSVar5->globalIndex_ * 4);
            pvVar1 = (this->selection2StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar9 = pvVar1 + lVar4;
            if (lVar7 == -1) goto LAB_0014be85;
            puVar8 = (uint *)(lVar7 * 4 +
                             *(long *)&pvVar1[lVar4 + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data);
          }
          std::vector<int,_std::allocator<int>_>::push_back(pvVar9,(value_type_conflict2 *)puVar8);
        }
        pSVar5 = SelectionManager::nextSelected(&this->seleMan2_,&local_40);
      }
    }
  }
  if (this->doBondProperties_ == true) {
    if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
      local_60.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = -1;
      std::vector<int,_std::allocator<int>_>::resize
                ((this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                 (ulong)(uint)this->info_->nGlobalBonds_,(value_type_conflict2 *)&local_60);
    }
    pBVar6 = SelectionManager::beginSelectedBond(&this->seleMan1_,&local_44);
    while (pBVar6 != (Bond *)0x0) {
      uVar2 = (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x11])
                        (this,(ulong)local_64,pBVar6);
      lVar4 = (long)(int)local_64;
      pvVar9 = (this->sele1ToIndex_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          *(long *)&pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data >> 2 == (ulong)uVar2) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (pBVar6->super_ShortRangeInteraction).globalIndex_;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar9 + lVar4,(int *)&local_60);
      }
      else {
        std::vector<int,_std::allocator<int>_>::resize(pvVar9 + lVar4,(ulong)(uVar2 + 1));
        *(int *)(*(long *)&(this->sele1ToIndex_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + (ulong)uVar2 * 4) =
             (pBVar6->super_ShortRangeInteraction).globalIndex_;
      }
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        pvVar9 = (this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(uint *)(*(long *)&pvVar9[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data +
                 (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4) = uVar2;
        lVar4 = (long)(int)local_64;
        if (lVar4 == 0) {
          pvVar9 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_0014bfd7:
          puVar8 = &local_64;
        }
        else {
          lVar7 = (long)*(int *)(*(long *)&pvVar9[lVar4 + -1].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4);
          pvVar1 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar9 = pvVar1 + lVar4;
          if (lVar7 == -1) goto LAB_0014bfd7;
          puVar8 = (uint *)(lVar7 * 4 +
                           *(long *)&pvVar1[lVar4 + -1].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data);
        }
        std::vector<int,_std::allocator<int>_>::push_back(pvVar9,(value_type_conflict2 *)puVar8);
      }
      if (this->uniqueSelections_ == false) {
        (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x12])(this,(ulong)local_64,pBVar6);
      }
      pBVar6 = SelectionManager::nextSelectedBond(&this->seleMan1_,&local_44);
    }
    if (this->uniqueSelections_ == true) {
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = -1;
        std::vector<int,_std::allocator<int>_>::resize
                  ((this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                   (ulong)(uint)this->info_->nGlobalBonds_,(value_type_conflict2 *)&local_60);
      }
      pBVar6 = SelectionManager::beginSelectedBond(&this->seleMan2_,&local_48);
      while (pBVar6 != (Bond *)0x0) {
        uVar2 = (*(this->super_DynamicProperty)._vptr_DynamicProperty
                  [(ulong)(this->autoCorrFunc_ ^ 1) + 0x11])(this,(ulong)local_64,pBVar6);
        lVar4 = (long)(int)local_64;
        pvVar9 = (this->sele2ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            *(long *)&pvVar9[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data >> 2 == (ulong)uVar2) {
          local_60.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (pBVar6->super_ShortRangeInteraction).globalIndex_;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar9 + lVar4,(int *)&local_60)
          ;
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(pvVar9 + lVar4,(ulong)(uVar2 + 1));
          *(int *)(*(long *)&(this->sele2ToIndex_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar2 * 4) =
               (pBVar6->super_ShortRangeInteraction).globalIndex_;
        }
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar9 = (this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(uint *)(*(long *)&pvVar9[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data +
                   (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4) = uVar2;
          lVar4 = (long)(int)local_64;
          if (lVar4 == 0) {
            pvVar9 = (this->selection2StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0014c150:
            puVar8 = &local_64;
          }
          else {
            lVar7 = (long)*(int *)(*(long *)&pvVar9[lVar4 + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4);
            pvVar1 = (this->selection2StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar9 = pvVar1 + lVar4;
            if (lVar7 == -1) goto LAB_0014c150;
            puVar8 = (uint *)(lVar7 * 4 +
                             *(long *)&pvVar1[lVar4 + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data);
          }
          std::vector<int,_std::allocator<int>_>::push_back(pvVar9,(value_type_conflict2 *)puVar8);
        }
        pBVar6 = SelectionManager::nextSelectedBond(&this->seleMan2_,&local_48);
      }
    }
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::computeFrame(int istep) {
    Molecule* mol;
    StuntDouble* sd;
    Bond* bond;
    int imol1, imol2, isd1, isd2, ibond1, ibond2;
    unsigned int index;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      validateSelection(seleMan1_);
    }

    if (uniqueSelections_ && evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      validateSelection(seleMan2_);
    }

    if (doSystemProperties_) {
      computeProperty1(istep);
      if (!autoCorrFunc_) computeProperty2(istep);
    }

    if (doMolecularProperties_) {
      // Map of molecular global IDs to selections
      if (selectionModeRestart_) 
	GIDtoSele1_[istep].resize(info_->getNGlobalMolecules(), -1);

      for (mol = seleMan1_.beginSelectedMolecule(imol1); mol != NULL;
           mol = seleMan1_.nextSelectedMolecule(imol1)) {
        index = computeProperty1(istep, mol);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(mol->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = mol->getGlobalIndex();
        }
	if (selectionModeRestart_) {
	  GIDtoSele1_[istep][mol->getGlobalIndex()] = index;
	  
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][mol->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}

        if (!uniqueSelections_) { index = computeProperty2(istep, mol); }
      }

      if (uniqueSelections_) {
	// Map of molecular global IDs to selections
	if (selectionModeRestart_) 	  
	  GIDtoSele2_[istep].resize(info_->getNGlobalMolecules(), -1);

        for (mol = seleMan2_.beginSelectedMolecule(imol2); mol != NULL;
             mol = seleMan2_.nextSelectedMolecule(imol2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, mol);
          } else {
            index = computeProperty2(istep, mol);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(mol->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = mol->getGlobalIndex();
          }
	  if (selectionModeRestart_) {
	    
	    GIDtoSele2_[istep][mol->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][mol->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else 	      
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }	  
        }
      }
    }

    if (doObjectProperties_) {
      // Map of StuntDouble global IDs to selections
      if (selectionModeRestart_)	
	GIDtoSele1_[istep].resize(info_->getNGlobalIntegrableObjects(), -1);
      
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        index = computeProperty1(istep, sd);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(sd->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = sd->getGlobalIndex();
        }

	if (selectionModeRestart_) {

	  GIDtoSele1_[istep][sd->getGlobalIndex()] = index;
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][sd->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}

        if (!uniqueSelections_) { index = computeProperty2(istep, sd); }
      }

      if (uniqueSelections_) {
	// Map of StuntDouble global IDs to selections
	if (selectionModeRestart_)
	  GIDtoSele2_[istep].resize(info_->getNGlobalIntegrableObjects(), -1);
	
        for (sd = seleMan2_.beginSelected(isd2); sd != NULL;
             sd = seleMan2_.nextSelected(isd2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, sd);
          } else {
            index = computeProperty2(istep, sd);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(sd->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = sd->getGlobalIndex();
          }
	  if (selectionModeRestart_) {

	    GIDtoSele2_[istep][sd->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][sd->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }
        }
      }
    }

    if (doBondProperties_) {
      // Map of bond global IDs to selections
      if (selectionModeRestart_) 
	GIDtoSele1_[istep].resize(info_->getNGlobalBonds(), -1);

      for (bond = seleMan1_.beginSelectedBond(ibond1); bond != NULL;
           bond = seleMan1_.nextSelectedBond(ibond1)) {
        index = computeProperty1(istep, bond);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(bond->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = bond->getGlobalIndex();
        }

	if (selectionModeRestart_) {
	  
	  GIDtoSele1_[istep][bond->getGlobalIndex()] = index;
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][bond->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}
	
        if (!uniqueSelections_) { index = computeProperty2(istep, bond); }
      }

      if (uniqueSelections_) {
	// Map of bond global IDs to selections
	if (selectionModeRestart_) 	 
	  GIDtoSele2_[istep].resize(info_->getNGlobalBonds(), -1);

        for (bond = seleMan2_.beginSelectedBond(ibond2); bond != NULL;
             bond = seleMan2_.nextSelectedBond(ibond2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, bond);
          } else {
            index = computeProperty2(istep, bond);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(bond->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = bond->getGlobalIndex();
          }
	  if (selectionModeRestart_) {

	    GIDtoSele2_[istep][bond->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][bond->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else	      
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }
        }
      }
    }
  }